

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O3

void __thiscall
om::file::_file_stream::_file_stream(_file_stream *this,string *file_name_,openmode open_mode_)

{
  char cVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->_vptr__file_stream = (_func_int **)&PTR_close_001ad928;
  std::fstream::fstream(&this->_stream,(string *)file_name_,open_mode_);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,"om::file::_file_stream: could not open ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)file_name_);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

explicit _file_stream(const std::string& file_name_, std::ios::openmode open_mode_)
				: _stream(file_name_, open_mode_)
			{
				if (!_stream.is_open())
					throw std::runtime_error("om::file::_file_stream: could not open " +file_name_);
			}